

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::TPZCompElHCurl(TPZCompElHCurl<pzshape::TPZShapeQuad> *this)

{
  long *plVar1;
  TPZRegisterClassId *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  TPZIntelGen<pzshape::TPZShapeQuad> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZManVector<long,_5> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHCurl<pzshape::TPZShapeQuad>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_025094e8);
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (in_stack_ffffffffffffffd0,
             (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(undefined ***)in_RDI = &PTR__TPZCompElHCurl_025090d0;
  *(undefined ***)in_RDI = &PTR__TPZCompElHCurl_025090d0;
  TPZManVector<long,_5>::TPZManVector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(long *)0xffffffffffffffff);
  *(undefined4 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  for (iVar2 = 0; iVar2 < 5; iVar2 = iVar2 + 1) {
    plVar1 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x50),(long)iVar2);
    *plVar1 = -1;
  }
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl() :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides-TSHAPE::NCornerNodes;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}